

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

jx9_value * GenStateNewStrObj(jx9_gen_state *pGen,sxi32 *pCount)

{
  jx9_value *pObj;
  sxu32 nIdx;
  
  nIdx = 0;
  pObj = jx9VmReserveConstObj(pGen->pVm,&nIdx);
  if (pObj == (jx9_value *)0x0) {
    GenStateOutOfMem(pGen);
  }
  else {
    *pCount = *pCount + 1;
    jx9MemObjInitFromString(pGen->pVm,pObj,(SyString *)0x0);
    jx9VmEmitInstr(pGen->pVm,4,0,nIdx,(void *)0x0,(sxu32 *)0x0);
  }
  return pObj;
}

Assistant:

static jx9_value * GenStateNewStrObj(jx9_gen_state *pGen,sxi32 *pCount)
{
	jx9_value *pConstObj;
	sxu32 nIdx = 0;
	/* Reserve a new constant */
	pConstObj = jx9VmReserveConstObj(pGen->pVm, &nIdx);
	if( pConstObj == 0 ){
		GenStateOutOfMem(&(*pGen));
		return 0;
	}
	(*pCount)++;
	jx9MemObjInitFromString(pGen->pVm, pConstObj, 0);
	/* Emit the load constant instruction */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, nIdx, 0, 0);
	return pConstObj;
}